

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O1

void test_stdio_over_pipes(int overlapped)

{
  uv_loop_t *loop;
  int iVar1;
  int64_t eval_b;
  int64_t eval_a_1;
  uv_stdio_container_t stdio [3];
  uv_process_t process;
  uv_stdio_container_t local_c8;
  uint local_b8;
  uv_pipe_t *local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  uv_process_t local_90;
  
  ::loop = uv_default_loop();
  iVar1 = uv_exepath(exepath,&exepath_size);
  local_90.data = (void *)(long)iVar1;
  local_c8.flags = UV_IGNORE;
  local_c8._4_4_ = 0;
  if (local_90.data == (void *)0x0) {
    exepath[exepath_size] = '\0';
    args[0] = exepath;
    args[1] = "stdio_over_pipes_helper";
    args[2] = (char *)0x0;
    options.file = exepath;
    options.args = args;
    options.exit_cb = exit_cb;
    uv_pipe_init(::loop,&out,0);
    uv_pipe_init(::loop,&in,0);
    options.stdio = &local_c8;
    local_b8 = (uint)(overlapped != 0) * 0x40;
    local_c8.flags = local_b8 + (UV_READABLE_PIPE|UV_CREATE_PIPE);
    local_c8.data.stream = (uv_stream_t *)&in;
    local_b8 = local_b8 | 0x21;
    local_b0 = &out;
    local_a8 = 2;
    local_a0 = 2;
    options.stdio_count = 3;
    iVar1 = uv_spawn(::loop,&local_90,&options);
    if (iVar1 != 0) goto LAB_001c0e13;
    iVar1 = uv_read_start((uv_stream_t *)&out,on_alloc,on_read);
    if (iVar1 != 0) goto LAB_001c0e20;
    iVar1 = uv_run(::loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001c0e2d;
    if (on_read_cb_called < 2) goto LAB_001c0e3a;
    if (after_write_cb_called != 2) goto LAB_001c0e47;
    if (exit_cb_called != 1) goto LAB_001c0e54;
    if (close_cb_called != 3) goto LAB_001c0e61;
    iVar1 = memcmp("hello world\nhello world\n",output,0x18);
    loop = ::loop;
    if (iVar1 != 0) goto LAB_001c0e6e;
    if (output_used == 0x18) {
      uv_walk(::loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      iVar1 = uv_loop_close(::loop);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001c0e88;
    }
  }
  else {
    test_stdio_over_pipes_cold_1();
LAB_001c0e13:
    test_stdio_over_pipes_cold_2();
LAB_001c0e20:
    test_stdio_over_pipes_cold_3();
LAB_001c0e2d:
    test_stdio_over_pipes_cold_4();
LAB_001c0e3a:
    test_stdio_over_pipes_cold_5();
LAB_001c0e47:
    test_stdio_over_pipes_cold_6();
LAB_001c0e54:
    test_stdio_over_pipes_cold_7();
LAB_001c0e61:
    test_stdio_over_pipes_cold_8();
LAB_001c0e6e:
    test_stdio_over_pipes_cold_9();
  }
  test_stdio_over_pipes_cold_10();
LAB_001c0e88:
  test_stdio_over_pipes_cold_11();
  test_stdio_over_pipes(1);
  return;
}

Assistant:

static void test_stdio_over_pipes(int overlapped) {
  int r;
  uv_process_t process;
  uv_stdio_container_t stdio[3];

  loop = uv_default_loop();

  init_process_options("stdio_over_pipes_helper", exit_cb);

  uv_pipe_init(loop, &out, 0);
  uv_pipe_init(loop, &in, 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE |
      (overlapped ?  UV_OVERLAPPED_PIPE : 0);
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE |
      (overlapped ? UV_OVERLAPPED_PIPE : 0);
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = uv_get_osfhandle(2);
  options.stdio_count = 3;

  r = uv_spawn(loop, &process, &options);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_GT(on_read_cb_called, 1);
  ASSERT_EQ(2, after_write_cb_called);
  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(3, close_cb_called);
  ASSERT_OK(memcmp("hello world\nhello world\n", output, 24));
  ASSERT_EQ(24, output_used);

  MAKE_VALGRIND_HAPPY(loop);
}